

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

scan_result * __thiscall
mjs::hoisting_visitor::scan_abi_cxx11_
          (scan_result *__return_storage_ptr__,hoisting_visitor *this,statement *s)

{
  undefined1 local_48 [8];
  hoisting_visitor hv;
  statement *s_local;
  
  hv.funcs_.
  super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  hoisting_visitor((hoisting_visitor *)local_48);
  accept<mjs::hoisting_visitor>
            ((statement *)
             hv.funcs_.
             super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(hoisting_visitor *)local_48);
  std::
  tuple<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
  ::
  tuple<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>,_true>
            (__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)local_48,
             (vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
              *)&hv.ids_.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ~hoisting_visitor((hoisting_visitor *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static scan_result scan(const statement& s) {
        hoisting_visitor hv{};
        accept(s, hv);
        return std::tuple(std::move(hv.ids_), std::move(hv.funcs_));
    }